

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O3

int INT_EVclient_shutdown(EVclient client,int result)

{
  CManager cm;
  FILE *pFVar1;
  int iVar2;
  __pid_t _Var3;
  CMFormat format;
  pthread_t pVar4;
  EVshutdown_contribution_msg msg;
  timespec ts;
  int local_3c;
  timespec local_38;
  
  format = INT_CMlookup_format(client->cm,EVclient_shutdown_contribution_format_list);
  if (client->already_shutdown != 0) {
    printf("Node %d, already shut down BAD!\n",(ulong)(uint)client->my_node_id);
  }
  local_3c = result;
  iVar2 = CMtrace_val[0xd];
  if (client->cm->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(client->cm,EVdfgVerbose);
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      pFVar1 = (FILE *)client->cm->CMTrace_file;
      _Var3 = getpid();
      pthread_self();
      fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_38);
      fprintf((FILE *)client->cm->CMTrace_file,"%lld.%.9ld - ",local_38.tv_sec);
    }
    fprintf((FILE *)client->cm->CMTrace_file,"Client %d calling client_shutdown\n",
            (ulong)(uint)client->my_node_id);
  }
  fflush((FILE *)client->cm->CMTrace_file);
  if (client->master_connection == (CMConnection)0x0) {
    queue_master_msg(client->master,&local_3c,DFGshutdown_contrib,(CMConnection)0x0,0);
  }
  else {
    INT_CMwrite(client->master_connection,format,&local_3c);
  }
  if (client->already_shutdown == 0) {
    IntCManager_unlock(client->cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                       ,0x6f7);
    iVar2 = CMtrace_val[0xd];
    if (client->cm->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(client->cm,EVdfgVerbose);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = (FILE *)client->cm->CMTrace_file;
        _Var3 = getpid();
        pVar4 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_38);
        fprintf((FILE *)client->cm->CMTrace_file,"%lld.%.9ld - ",local_38.tv_sec,local_38.tv_nsec);
      }
      fprintf((FILE *)client->cm->CMTrace_file,"Client %d shutdown condition wait\n",
              (ulong)(uint)client->my_node_id);
    }
    fflush((FILE *)client->cm->CMTrace_file);
    cm = client->cm;
    iVar2 = new_shutdown_condition(client,client->master_connection);
    CMCondition_wait(cm,iVar2);
    iVar2 = CMtrace_val[0xd];
    if (client->cm->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(client->cm,EVdfgVerbose);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = (FILE *)client->cm->CMTrace_file;
        _Var3 = getpid();
        pVar4 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_38);
        fprintf((FILE *)client->cm->CMTrace_file,"%lld.%.9ld - ",local_38.tv_sec,local_38.tv_nsec);
      }
      fprintf((FILE *)client->cm->CMTrace_file,"Client %d shutdown condition wait DONE!\n",
              (ulong)(uint)client->my_node_id);
    }
    fflush((FILE *)client->cm->CMTrace_file);
    IntCManager_lock(client->cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                     ,0x6fb);
  }
  return client->shutdown_value;
}

Assistant:

extern int
INT_EVclient_shutdown(EVclient client, int result)
{
    CMFormat shutdown_msg = INT_CMlookup_format(client->cm, EVclient_shutdown_contribution_format_list);
    EVshutdown_contribution_msg msg;
    if (client->already_shutdown) printf("Node %d, already shut down BAD!\n", client->my_node_id);
    msg.value = result;
    CMtrace_out(client->cm, EVdfgVerbose, "Client %d calling client_shutdown\n", client->my_node_id);
    if (client->master_connection == NULL) {
	queue_master_msg(client->master, (void*)&msg, DFGshutdown_contrib, NULL, /*copy*/0);
    } else {
	/* we are a client, tell the master to shutdown */
	INT_CMwrite(client->master_connection, shutdown_msg, &msg);
    }
    if (!client->already_shutdown) {
	CManager_unlock(client->cm);
	CMtrace_out(client->cm, EVdfgVerbose, "Client %d shutdown condition wait\n", client->my_node_id);
	CMCondition_wait(client->cm, new_shutdown_condition(client, client->master_connection));
	CMtrace_out(client->cm, EVdfgVerbose, "Client %d shutdown condition wait DONE!\n", client->my_node_id);
	CManager_lock(client->cm);
    }
    return client->shutdown_value;
}